

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

void emit_GLSL_LIT(Context *ctx)

{
  size_t in_RCX;
  char src0 [64];
  char code [128];
  char acStack_d8 [64];
  char local_98 [136];
  
  make_GLSL_srcarg_string_full(ctx,0,acStack_d8,in_RCX);
  if (ctx->glsl_generated_lit_helper == 0) {
    ctx->glsl_generated_lit_helper = 1;
    push_output(ctx,&ctx->helpers);
    output_line(ctx,"vec4 LIT(const vec4 src)");
    output_line(ctx,"{");
    ctx->indent = ctx->indent + 1;
    output_line(ctx,"float power = clamp(src.w, -%s, %s);","127.9961");
    output_line(ctx,"vec4 retval = vec4(1.0, 0.0, 0.0, 1.0);");
    output_line(ctx,"if (src.x > 0.0) {");
    ctx->indent = ctx->indent + 1;
    output_line(ctx,"retval.y = src.x;");
    output_line(ctx,"if (src.y > 0.0) {");
    ctx->indent = ctx->indent + 1;
    output_line(ctx,"retval.z = pow(src.y, power);");
    ctx->indent = ctx->indent + -1;
    output_line(ctx,"}");
    ctx->indent = ctx->indent + -1;
    output_line(ctx,"}");
    output_line(ctx,"return retval;");
    ctx->indent = ctx->indent + -1;
    output_line(ctx,"}");
    output_blank_line(ctx);
    pop_output(ctx);
  }
  make_GLSL_destarg_assign(ctx,local_98,0x80,"LIT(%s)",acStack_d8);
  output_line(ctx,"%s",local_98);
  return;
}

Assistant:

static void emit_GLSL_LIT(Context *ctx)
{
    char src0[64]; make_GLSL_srcarg_string_full(ctx, 0, src0, sizeof (src0));
    char code[128];
    emit_GLSL_LIT_helper(ctx);
    make_GLSL_destarg_assign(ctx, code, sizeof (code), "LIT(%s)", src0);
    output_line(ctx, "%s", code);
}